

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chunk.cpp
# Opt level: O3

ostream * operator<<(ostream *out,Chunk *chunk)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  ostream *poVar3;
  uint x;
  long lVar4;
  uint y;
  long lVar5;
  
  lVar5 = 0;
  do {
    lVar4 = 0;
    do {
      pp_Var1 = out->_vptr_basic_ostream;
      *(undefined8 *)(&out->field_0x10 + (long)pp_Var1[-3]) = 8;
      p_Var2 = pp_Var1[-3];
      *(uint *)(&out->field_0x18 + (long)p_Var2) =
           *(uint *)(&out->field_0x18 + (long)p_Var2) & 0xffffffb5 | 8;
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)out);
      *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x20);
    std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x20);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Chunk& chunk) {
    for (unsigned int y = 0; y < Chunk::WIDTH; ++y) {
        for (unsigned int x = 0; x < Chunk::WIDTH; ++x) {
            out << std::setw(8) << std::hex << *reinterpret_cast<const uint32_t*>(&chunk.tiles_[y * Chunk::WIDTH + x]) << std::dec << " ";
        }
        out << "\n";
    }
    return out;
}